

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void aom_get_var_sse_sum_8x8_quad_avx2
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  __m256i set_one_minusone;
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar6 [16];
  __m256i sum_8x16 [2];
  __m256i sse_8x16 [2];
  undefined1 in_stack_fffffffffffffee0 [16];
  __m256i local_e0;
  undefined1 local_c0 [32];
  __m256i local_a0;
  undefined1 local_80 [32];
  undefined1 auVar5 [64];
  
  local_e0 = (__m256i)ZEXT1632(ZEXT816(0) << 0x40);
  local_c0 = ZEXT1632(ZEXT816(0) << 0x40);
  iVar1 = 8;
  auVar3._8_8_ = 0xff01ff01ff01ff01;
  auVar3._0_8_ = 0xff01ff01ff01ff01;
  auVar3._16_8_ = 0xff01ff01ff01ff01;
  auVar3._24_8_ = 0xff01ff01ff01ff01;
  auVar5 = ZEXT3264(auVar3);
  local_a0 = local_e0;
  local_80 = local_c0;
  while( true ) {
    auVar4 = auVar5._0_32_;
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    auVar5 = ZEXT3264(auVar3);
    set_one_minusone[2] = (longlong)sse8x8;
    set_one_minusone[0] = in_stack_fffffffffffffee0._0_8_;
    set_one_minusone[1] = in_stack_fffffffffffffee0._8_8_;
    set_one_minusone[3] = (longlong)sum8x8;
    calc_sum_sse_wd32_avx2(src_ptr,ref_ptr,set_one_minusone,&local_a0,&local_e0);
    src_ptr = src_ptr + source_stride;
    ref_ptr = ref_ptr + ref_stride;
  }
  calc_sum_sse_order(&local_a0,&local_e0,tot_sse,tot_sum);
  *(undefined1 (*) [16])sse8x8 = auVar4._0_16_;
  auVar6 = auVar4._16_16_;
  *(undefined1 (*) [16])sum8x8 = auVar6;
  auVar6 = vpmulld_avx(auVar6,auVar6);
  auVar6 = vpsrld_avx(auVar6,6);
  auVar6 = vpsubd_avx(auVar4._0_16_,auVar6);
  *(undefined1 (*) [16])var8x8 = auVar6;
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_avx2(const uint8_t *src_ptr,
                                       int source_stride,
                                       const uint8_t *ref_ptr, int ref_stride,
                                       uint32_t *sse8x8, int *sum8x8,
                                       unsigned int *tot_sse, int *tot_sum,
                                       uint32_t *var8x8) {
  get_var_sse_sum_8x8_quad_avx2(src_ptr, source_stride, ref_ptr, ref_stride, 8,
                                sse8x8, sum8x8, tot_sse, tot_sum, var8x8);
}